

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf_clear(bcf1_t *v)

{
  uint *puVar1;
  uint uVar2;
  bcf_info_t *pbVar3;
  bcf_fmt_t *pbVar4;
  anon_union_4_2_947300a4 u;
  long lVar5;
  int i;
  long lVar6;
  
  lVar5 = 0x1c;
  for (lVar6 = 0; lVar6 < (v->d).m_info; lVar6 = lVar6 + 1) {
    pbVar3 = (v->d).info;
    uVar2 = *(uint *)((long)&pbVar3->key + lVar5);
    if ((int)uVar2 < 0) {
      free((void *)(*(long *)((long)pbVar3 + lVar5 + -0xc) - (ulong)(uVar2 & 0x7fffffff)));
      puVar1 = (uint *)((long)&((v->d).info)->key + lVar5);
      *puVar1 = *puVar1 & 0x7fffffff;
    }
    lVar5 = lVar5 + 0x20;
  }
  lVar5 = 0x1c;
  for (lVar6 = 0; lVar6 < (v->d).m_fmt; lVar6 = lVar6 + 1) {
    pbVar4 = (v->d).fmt;
    uVar2 = *(uint *)((long)&pbVar4->id + lVar5);
    if ((int)uVar2 < 0) {
      free((void *)(*(long *)((long)pbVar4 + lVar5 + -0xc) - (ulong)(uVar2 & 0x7fffffff)));
      puVar1 = (uint *)((long)&((v->d).fmt)->id + lVar5);
      *puVar1 = *puVar1 & 0x7fffffff;
    }
    lVar5 = lVar5 + 0x20;
  }
  v->unpacked = 0;
  v->rlen = 0;
  v->rid = 0;
  v->pos = 0;
  v->qual = (float)bcf_float_missing;
  (v->indiv).l = 0;
  *(undefined8 *)&v->field_0x10 = 0;
  (v->shared).l = 0;
  (v->d).var_type = -1;
  (v->d).shared_dirty = 0;
  (v->d).indiv_dirty = 0;
  (v->d).n_flt = 0;
  v->errcode = 0;
  if ((v->d).m_als != 0) {
    *(v->d).als = '\0';
  }
  if ((v->d).m_id != 0) {
    *(v->d).id = '\0';
  }
  return;
}

Assistant:

void bcf_clear(bcf1_t *v)
{
    int i;
    for (i=0; i<v->d.m_info; i++)
    {
        if ( v->d.info[i].vptr_free )
        {
            free(v->d.info[i].vptr - v->d.info[i].vptr_off);
            v->d.info[i].vptr_free = 0;
        }
    }
    for (i=0; i<v->d.m_fmt; i++)
    {
        if ( v->d.fmt[i].p_free )
        {
            free(v->d.fmt[i].p - v->d.fmt[i].p_off);
            v->d.fmt[i].p_free = 0;
        }
    }
    v->rid = v->pos = v->rlen = v->unpacked = 0;
    bcf_float_set_missing(v->qual);
    v->n_info = v->n_allele = v->n_fmt = v->n_sample = 0;
    v->shared.l = v->indiv.l = 0;
    v->d.var_type = -1;
    v->d.shared_dirty = 0;
    v->d.indiv_dirty  = 0;
    v->d.n_flt = 0;
    v->errcode = 0;
    if (v->d.m_als) v->d.als[0] = 0;
    if (v->d.m_id) v->d.id[0] = 0;
}